

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uic.cpp
# Opt level: O0

ssize_t __thiscall Uic::write(Uic *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  int iVar2;
  Driver *this_00;
  DomUI *pDVar3;
  char *pcVar4;
  ssize_t sVar5;
  void *__buf_00;
  undefined4 in_register_00000034;
  QXmlStreamReader *reader_00;
  long in_FS_OFFSET;
  double dVar6;
  QLatin1StringView QVar7;
  QString *language;
  double version;
  QXmlStreamReader reader;
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_> ui;
  DomUI *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  DomUI *in_stack_ffffffffffffff38;
  FILE *__stream;
  byte local_61;
  QString local_48;
  bool local_30 [24];
  undefined8 local_18;
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_> local_10;
  long local_8;
  
  reader_00 = (QXmlStreamReader *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_10.d = (DomUI *)0xaaaaaaaaaaaaaaaa;
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::QScopedPointer(&local_10,(DomUI *)0x0);
  local_18 = 0xaaaaaaaaaaaaaaaa;
  QXmlStreamReader::QXmlStreamReader((QXmlStreamReader *)&local_18);
  QXmlStreamReader::setDevice((QIODevice *)&local_18);
  parseUiFile(reader_00);
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::reset
            ((QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),in_stack_ffffffffffffff38
            );
  QXmlStreamReader::~QXmlStreamReader((QXmlStreamReader *)&local_18);
  bVar1 = QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::isNull(&local_10);
  if (bVar1) {
    local_61 = 0;
    goto LAB_001ec657;
  }
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::operator->(&local_10);
  DomUI::attributeVersion(in_stack_ffffffffffffff28);
  dVar6 = (double)QString::toDouble(local_30);
  QString::~QString((QString *)0x1ec4be);
  if (dVar6 < 4.0) {
    fprintf(_stderr,"uic: File generated with too old version of Qt Widgets Designer\n");
    local_61 = 0;
    goto LAB_001ec657;
  }
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::operator->(&local_10);
  DomUI::attributeLanguage(in_stack_ffffffffffffff28);
  this_00 = driver(this);
  pDVar3 = QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::operator->(&local_10);
  bVar1 = DomUI::attributeIdbasedtr(pDVar3);
  Driver::setUseIdBasedTranslations(this_00,bVar1);
  bVar1 = QString::isEmpty((QString *)0x1ec57b);
  if (bVar1) {
LAB_001ec622:
    pDVar3 = QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::data(&local_10);
    sVar5 = write(this,(int)pDVar3,__buf_00,__n);
    local_61 = (byte)sVar5 & 1;
  }
  else {
    QVar7 = Qt::Literals::StringLiterals::operator____L1
                      ((char *)in_stack_ffffffffffffff38,
                       CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
    __n = 0;
    iVar2 = QString::compare((QLatin1String *)&local_48,(CaseSensitivity)QVar7.m_size);
    if (iVar2 == 0) goto LAB_001ec622;
    __stream = _stderr;
    QtPrivate::asString(&local_48);
    QString::toLocal8Bit((QString *)this_00);
    pcVar4 = QByteArray::constData((QByteArray *)0x1ec5f3);
    fprintf(__stream,"uic: File is not a \"c++\" ui file, language=%s\n",pcVar4);
    QByteArray::~QByteArray((QByteArray *)0x1ec613);
    local_61 = 0;
  }
  QString::~QString((QString *)0x1ec657);
LAB_001ec657:
  QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_>::~QScopedPointer
            ((QScopedPointer<DomUI,_QScopedPointerDeleter<DomUI>_> *)
             CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_61);
  }
  __stack_chk_fail();
}

Assistant:

bool Uic::write(QIODevice *in)
{
    QScopedPointer<DomUI> ui;
    {
        QXmlStreamReader reader;
        reader.setDevice(in);
        ui.reset(parseUiFile(reader));
    }

    if (ui.isNull())
        return false;

    double version = ui->attributeVersion().toDouble();
    if (version < 4.0) {
        fprintf(stderr, "uic: File generated with too old version of Qt Widgets Designer\n");
        return false;
    }

    const QString &language = ui->attributeLanguage();
    driver()->setUseIdBasedTranslations(ui->attributeIdbasedtr());

    if (!language.isEmpty() && language.compare("c++"_L1, Qt::CaseInsensitive) != 0) {
        fprintf(stderr, "uic: File is not a \"c++\" ui file, language=%s\n", qPrintable(language));
        return false;
    }

    return write(ui.data());
}